

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBatchTestHandler.cxx
# Opt level: O3

void __thiscall
cmCTestBatchTestHandler::WriteSrunArgs(cmCTestBatchTestHandler *this,int test,ostream *fout)

{
  mapped_type pcVar1;
  mapped_type *ppcVar2;
  ostream *poVar3;
  key_type local_14;
  
  ppcVar2 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->super_cmCTestMultiProcessHandler).Properties.
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_14);
  pcVar1 = *ppcVar2;
  std::__ostream_insert<char,std::char_traits<char>>(fout,"srun ",5);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"-J=",3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,(pcVar1->Name)._M_dataplus._M_p,(pcVar1->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (pcVar1->RunSerial == true) {
    std::__ostream_insert<char,std::char_traits<char>>(fout,"--exclusive ",0xc);
  }
  if (1 < pcVar1->Processors) {
    std::__ostream_insert<char,std::char_traits<char>>(fout,"-n",2);
    poVar3 = (ostream *)std::ostream::operator<<(fout,pcVar1->Processors);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  }
  return;
}

Assistant:

void cmCTestBatchTestHandler::WriteSrunArgs(int test, std::ostream& fout)
{
  cmCTestTestHandler::cmCTestTestProperties* properties =
    this->Properties[test];

  fout << "srun ";
  // fout << "--jobid=" << test << " ";
  fout << "-J=" << properties->Name << " ";

  // Write dependency information
  /*if(!this->Tests[test].empty())
    {
      fout << "-P=afterany";
      for(TestSet::iterator i = this->Tests[test].begin();
          i != this->Tests[test].end(); ++i)
        {
          fout << ":" << *i;
        }
      fout << " ";
    }*/
  if (properties->RunSerial) {
    fout << "--exclusive ";
  }
  if (properties->Processors > 1) {
    fout << "-n" << properties->Processors << " ";
  }
}